

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O0

int uttamarin::EditDistance(string *A,string *B)

{
  int iVar1;
  size_type __n;
  size_type __n_00;
  allocator<std::vector<int,_std::allocator<int>_>_> local_5d [16];
  allocator<int> local_4d;
  value_type_conflict1 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  undefined1 local_30 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dp;
  string *B_local;
  string *A_local;
  
  dp.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)B;
  __n = std::__cxx11::string::size();
  __n_00 = std::__cxx11::string::size();
  local_4c = -1;
  std::allocator<int>::allocator(&local_4d);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n_00,&local_4c,&local_4d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(local_5d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,__n,&local_48,local_5d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(local_5d);
  std::vector<int,_std::allocator<int>_>::~vector(&local_48);
  std::allocator<int>::~allocator(&local_4d);
  iVar1 = EditDistanceHelper(A,0,B,0,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_30);
  return iVar1;
}

Assistant:

int EditDistance(const string& A, const string B) { 
  vector<vector<int>> dp(A.size(), vector<int>(B.size(), -1)); 
  return EditDistanceHelper(A, 0, B, 0, dp); 
}